

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPDistScheduleClause::generateDOT
          (OpenMPDistScheduleClause *this,ofstream *dot_file,int depth,int index,string *parent_node
          )

{
  bool bVar1;
  string sStack_1c8;
  string chunk_size;
  string chunk_size_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string clause_kind;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  std::__cxx11::to_string(&chunk_size_name,depth);
  std::operator+(&chunk_size,"dist_schedule_",&chunk_size_name);
  std::operator+(&parameter_string,&chunk_size,"_");
  std::__cxx11::to_string(&sStack_1c8,index);
  std::operator+(&clause_kind,&parameter_string,&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&chunk_size);
  std::__cxx11::string::~string((string *)&chunk_size_name);
  std::operator+(&sStack_1c8,&indent,parent_node);
  std::operator+(&chunk_size_name,&sStack_1c8,"-- ");
  std::operator+(&chunk_size,&chunk_size_name,&clause_kind);
  std::operator+(&parameter_string,&chunk_size,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&parameter_string);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&chunk_size);
  std::__cxx11::string::~string((string *)&chunk_size_name);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  if (this->dist_schedule_kind == OMPC_DIST_SCHEDULE_KIND_static) {
    std::__cxx11::string::assign((char *)&parameter_string);
    if (parameter_string._M_string_length != 0) {
      std::operator+(&chunk_size,&clause_kind,"_kind");
      std::operator+(&local_168,&indent,&clause_kind);
      std::operator+(&local_148,&local_168," -- ");
      std::operator+(&sStack_1c8,&local_148,&chunk_size);
      std::operator+(&chunk_size_name,&sStack_1c8,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&chunk_size_name);
      std::__cxx11::string::~string((string *)&chunk_size_name);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_c8,&indent,"\t");
      std::operator+(&local_a8,&local_c8,&chunk_size);
      std::operator+(&local_108,&local_a8," [label = \"");
      std::operator+(&local_168,&local_108,&chunk_size);
      std::operator+(&local_148,&local_168,"\\n ");
      std::operator+(&sStack_1c8,&local_148,&parameter_string);
      std::operator+(&chunk_size_name,&sStack_1c8,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&chunk_size_name);
      std::__cxx11::string::~string((string *)&chunk_size_name);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&chunk_size);
    }
  }
  std::__cxx11::string::string((string *)&chunk_size,(string *)&this->chunk_size);
  bVar1 = std::operator!=(&chunk_size,"");
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)&parameter_string);
    std::operator+(&chunk_size_name,&clause_kind,"_chunk_size");
    std::operator+(&local_108,&indent,&clause_kind);
    std::operator+(&local_168,&local_108," -- ");
    std::operator+(&local_148,&local_168,&chunk_size_name);
    std::operator+(&sStack_1c8,&local_148,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_108);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_48,&indent,"\t");
    std::operator+(&local_c8,&local_48,&chunk_size_name);
    std::operator+(&local_a8,&local_c8," [label = \"");
    std::operator+(&local_108,&local_a8,&chunk_size_name);
    std::operator+(&local_168,&local_108,"\\n ");
    std::operator+(&local_148,&local_168,&parameter_string);
    std::operator+(&sStack_1c8,&local_148,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_48);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&chunk_size_name);
  }
  std::__cxx11::string::~string((string *)&chunk_size);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&clause_kind);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  return;
}

Assistant:

void OpenMPDistScheduleClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "dist_schedule_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDistScheduleClauseKind kind = this->getKind();
    std::string parameter_string;
    switch (kind) {
        case OMPC_DIST_SCHEDULE_KIND_static:
            parameter_string = "static";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

    std::string chunk_size = this->getChunkSize();
    if (chunk_size != "") {
        parameter_string = chunk_size;
        std::string chunk_size_name = clause_kind + "_chunk_size";
        current_line = indent + clause_kind + " -- " + chunk_size_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + chunk_size_name + " [label = \"" + chunk_size_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    }; 
}